

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int mark_frames_on_pto(quicly_conn_t *conn,uint8_t ack_epoch,size_t *bytes_to_mark)

{
  int iVar1;
  quicly_sent_packet_t *pqVar2;
  st_quicly_sent_block_t *psVar3;
  quicly_sentmap_t *in_RDX;
  uint8_t in_SIL;
  int ret;
  quicly_sent_packet_t *sent;
  quicly_sentmap_iter_t iter;
  quicly_sentmap_iter_t *in_stack_ffffffffffffffa8;
  quicly_conn_t *in_stack_ffffffffffffffb0;
  quicly_sentmap_event_t in_stack_ffffffffffffffd4;
  quicly_sentmap_iter_t *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = init_acks_iter(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (local_4 == 0) {
    do {
      while( true ) {
        pqVar2 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x1485d6);
        if (pqVar2->packet_number == 0xffffffffffffffff) goto LAB_001486db;
        if ((pqVar2->ack_epoch == in_SIL) && (((byte)pqVar2->field_0x11 >> 1 & 1) != 0)) break;
        quicly_sentmap_skip((quicly_sentmap_iter_t *)0x1486d6);
      }
      if ((st_quicly_sent_block_t *)(ulong)pqVar2->cc_bytes_in_flight < in_RDX->head) {
        psVar3 = (st_quicly_sent_block_t *)((long)in_RDX->head - (ulong)pqVar2->cc_bytes_in_flight);
      }
      else {
        psVar3 = (st_quicly_sent_block_t *)0x0;
      }
      in_RDX->head = psVar3;
      iVar1 = quicly_sentmap_update(in_RDX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (((byte)pqVar2->field_0x11 >> 1 & 1) != 0) {
        __assert_fail("!sent->frames_in_flight",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0xe1d,"int mark_frames_on_pto(quicly_conn_t *, uint8_t, size_t *)");
      }
    } while (in_RDX->head != (st_quicly_sent_block_t *)0x0);
LAB_001486db:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int mark_frames_on_pto(quicly_conn_t *conn, uint8_t ack_epoch, size_t *bytes_to_mark)
{
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;
    int ret;

    if ((ret = init_acks_iter(conn, &iter)) != 0)
        return ret;

    while ((sent = quicly_sentmap_get(&iter))->packet_number != UINT64_MAX) {
        if (sent->ack_epoch == ack_epoch && sent->frames_in_flight) {
            *bytes_to_mark = *bytes_to_mark > sent->cc_bytes_in_flight ? *bytes_to_mark - sent->cc_bytes_in_flight : 0;
            if ((ret = quicly_sentmap_update(&conn->egress.loss.sentmap, &iter, QUICLY_SENTMAP_EVENT_PTO)) != 0)
                return ret;
            assert(!sent->frames_in_flight);
            if (*bytes_to_mark == 0)
                break;
        } else {
            quicly_sentmap_skip(&iter);
        }
    }

    return 0;
}